

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  int iVar3;
  void *local_58;
  int *local_50;
  size_t local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  size_t local_30;
  
  (**mb->_vptr_ModelBin)(&local_58,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->weight_data;
  if (pMVar1 != (Mat *)&local_58) {
    if (local_50 != (int *)0x0) {
      LOCK();
      *local_50 = *local_50 + 1;
      UNLOCK();
    }
    piVar2 = (this->weight_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (pMVar1->data != (void *)0x0)) {
        free(*(void **)((long)pMVar1->data + -8));
      }
    }
    (this->weight_data).data = local_58;
    (this->weight_data).refcount = local_50;
    (this->weight_data).elemsize = local_48;
    (this->weight_data).dims = (undefined4)local_40;
    (this->weight_data).w = local_40._4_4_;
    (this->weight_data).h = (undefined4)uStack_38;
    (this->weight_data).c = uStack_38._4_4_;
    (this->weight_data).cstep = local_30;
  }
  if (local_50 != (int *)0x0) {
    LOCK();
    *local_50 = *local_50 + -1;
    UNLOCK();
    if ((*local_50 == 0) && (local_58 != (void *)0x0)) {
      free(*(void **)((long)local_58 + -8));
    }
  }
  iVar3 = -100;
  if ((pMVar1->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(&local_58,mb,(ulong)(uint)this->num_output,1);
      pMVar1 = &this->bias_data;
      if (pMVar1 != (Mat *)&local_58) {
        if (local_50 != (int *)0x0) {
          LOCK();
          *local_50 = *local_50 + 1;
          UNLOCK();
        }
        piVar2 = (this->bias_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (pMVar1->data != (void *)0x0)) {
            free(*(void **)((long)pMVar1->data + -8));
          }
        }
        (this->bias_data).data = local_58;
        (this->bias_data).refcount = local_50;
        (this->bias_data).elemsize = local_48;
        (this->bias_data).dims = (undefined4)local_40;
        (this->bias_data).w = local_40._4_4_;
        (this->bias_data).h = (undefined4)uStack_38;
        (this->bias_data).c = uStack_38._4_4_;
        (this->bias_data).cstep = local_30;
      }
      if (local_50 != (int *)0x0) {
        LOCK();
        *local_50 = *local_50 + -1;
        UNLOCK();
        if ((*local_50 == 0) && (local_58 != (void *)0x0)) {
          free(*(void **)((long)local_58 + -8));
        }
      }
      if (pMVar1->data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}